

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

InsertionOrderIndex * __thiscall
kj::InsertionOrderIndex::operator=(InsertionOrderIndex *this,InsertionOrderIndex *other)

{
  Fault local_20;
  Fault f;
  InsertionOrderIndex *other_local;
  InsertionOrderIndex *this_local;
  
  if (other != this) {
    this->capacity = other->capacity;
    this->links = other->links;
    other->capacity = 0;
    other->links = (Link *)&EMPTY_LINK;
    return this;
  }
  f.exception = (Exception *)other;
  _::Debug::Fault::Fault
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
             ,0x331,FAILED,"&other != this","");
  _::Debug::Fault::fatal(&local_20);
}

Assistant:

InsertionOrderIndex& InsertionOrderIndex::operator=(InsertionOrderIndex&& other) {
  KJ_DASSERT(&other != this);
  capacity = other.capacity;
  links = other.links;
  other.capacity = 0;
  other.links = const_cast<Link*>(&EMPTY_LINK);
  return *this;
}